

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O3

textblock * object_info_out(object *obj,wchar_t mode)

{
  bitflag *flags_00;
  random_value *prVar1;
  byte bVar2;
  short sVar3;
  object *poVar4;
  monster_race *pmVar5;
  curse_data *pcVar6;
  ego_item *peVar7;
  _Bool *p_Var8;
  random_value v;
  random_value v_00;
  random_value v_01;
  int iVar9;
  player *ppVar10;
  _Bool _Var11;
  _Bool _Var12;
  _Bool _Var13;
  _Bool _Var14;
  wchar_t wVar15;
  int iVar16;
  wchar_t wVar17;
  textblock *tb;
  artifact_set *paVar18;
  set_item *psVar19;
  obj_property *poVar20;
  angband_constants *paVar21;
  char **ppcVar22;
  effect *peVar23;
  wchar_t *pwVar24;
  textblock *tba;
  object *poVar25;
  undefined7 extraout_var;
  long lVar26;
  player_state_conflict *ppVar27;
  curse_data *c;
  undefined8 *puVar28;
  wchar_t i;
  int iVar29;
  wchar_t wVar30;
  ulong uVar31;
  uint8_t uVar32;
  undefined2 uVar33;
  char *pcVar34;
  long lVar35;
  byte bVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  char *pcVar40;
  ulong uVar41;
  ulong uVar42;
  wchar_t count;
  uint uVar43;
  int iVar44;
  ulong uVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  object *obj1;
  bitflag flags [6];
  wchar_t deciturns [5];
  element_info el_info [28];
  char name [80];
  char loot_spot [80];
  bool local_5f1;
  int local_5d4;
  bitflag local_5be [6];
  uint local_5b8;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  wchar_t local_5a4;
  object *local_5a0;
  uint local_598 [8];
  undefined2 uStack_578;
  byte abStack_576 [110];
  player_state_conflict local_508;
  player_state_conflict local_3c8 [2];
  
  tb = textblock_new();
  if (obj->known == (object *)0x0) {
    __assert_fail("obj->known",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-info.c"
                  ,0x7c1,"textblock *object_info_out(const struct object *, int)");
  }
  if (obj->kind != obj->known->kind) {
    pcVar34 = "\n\nYou do not know what this is.\n";
    goto LAB_001989c2;
  }
  if ((mode & 4U) == 0) {
    object_flags_known(obj,local_5be);
    if ((mode & 1U) != 0) {
      flag_diff(local_5be,obj->kind->base->flags,6);
    }
  }
  else {
    object_flags(obj,local_5be);
  }
  poVar25 = player->obj_k;
  poVar4 = obj->known;
  lVar26 = 0;
  do {
    if (((mode & 0x10U) != 0) ||
       (uVar33 = 100, *(short *)((long)&poVar25->el_info[0].res_level + lVar26) != 0)) {
      uVar33 = *(undefined2 *)((long)&poVar4->el_info[0].res_level + lVar26);
    }
    *(undefined2 *)((long)&uStack_578 + lVar26) = uVar33;
    bVar36 = (&poVar4->el_info[0].flags)[lVar26];
    abStack_576[lVar26] = bVar36;
    bVar2 = (&obj->el_info[0].flags)[lVar26];
    if ((bVar2 & 2) != 0) {
      bVar36 = (bVar2 & 1) - 3 & bVar36;
      abStack_576[lVar26] = bVar36;
    }
    if ((mode & 1U) != 0) {
      abStack_576[lVar26] = bVar36 & 0xfe;
    }
    lVar26 = lVar26 + 4;
  } while (lVar26 != 0x70);
  if ((mode & 2U) == 0) goto LAB_00198d00;
  if (((mode & 1U) != 0) && (_Var11 = obj_can_wear(obj), !_Var11))
  goto switchD_00198ca6_caseD_ffffffff;
  if ((obj->origin != 0x18) || (uVar38 = 1, obj->mimicking_m_idx == 0)) {
    uVar38 = (uint)obj->origin;
  }
  pcVar34 = level_name(world->levels + obj->origin_place);
  strnfmt((char *)local_3c8,0x50,"in %s",pcVar34);
  pmVar5 = obj->origin_race;
  if (pmVar5 == (monster_race *)0x0) {
    _Var11 = is_a_vowel(L'm');
    pcVar34 = "a ";
    if (_Var11) {
      pcVar34 = "an ";
    }
    my_strcpy((char *)&local_508,pcVar34,0x50);
    pcVar34 = "monster lost to history";
LAB_00198c6e:
    my_strcat((char *)&local_508,pcVar34,0x50);
  }
  else {
    pcVar34 = pmVar5->name;
    _Var11 = flag_has_dbg(pmVar5->flags,0xc,1,"obj->origin_race->flags","RF_UNIQUE");
    _Var12 = flag_has_dbg(obj->origin_race->flags,0xc,6,"obj->origin_race->flags","RF_NAME_COMMA");
    _Var13 = is_a_vowel((int)*pcVar34);
    pcVar40 = "a ";
    if (_Var13) {
      pcVar40 = "an ";
    }
    if ((!_Var11) ||
       (_Var11 = flag_has_dbg(obj->origin_race->flags,0xc,2,"obj->origin_race->flags",
                              "RF_PLAYER_GHOST"), _Var11)) {
      my_strcpy((char *)&local_508,pcVar40,0x50);
      my_strcat((char *)&local_508,pcVar34,0x50);
    }
    else {
      my_strcpy((char *)&local_508,pcVar34,0x50);
    }
    if (_Var12) {
      pcVar34 = ",";
      goto LAB_00198c6e;
    }
  }
  uVar31 = (ulong)(uVar38 << 4);
  switch(*(undefined4 *)((long)&origins[0].args + uVar31)) {
  case 0:
    ppVar27 = *(player_state_conflict **)((long)&origins[0].desc + uVar31);
    pcVar34 = "%s";
    goto LAB_00198cc1;
  case 1:
    pcVar34 = *(char **)((long)&origins[0].desc + uVar31);
    ppVar27 = local_3c8;
LAB_00198cc1:
    textblock_append(tb,pcVar34,ppVar27);
    break;
  case 2:
    textblock_append(tb,*(char **)((long)&origins[0].desc + uVar31),&local_508,local_3c8);
    break;
  case 0xffffffff:
    goto switchD_00198ca6_caseD_ffffffff;
  }
  textblock_append(tb,"\n\n");
switchD_00198ca6_caseD_ffffffff:
LAB_00198d00:
  if ((mode & 1U) == 0) {
    if (((obj->artifact != (artifact *)0x0) && (obj->known->artifact != (artifact *)0x0)) &&
       (pcVar34 = obj->artifact->text, pcVar34 != (char *)0x0)) goto LAB_00198dbe;
    _Var11 = object_flavor_is_aware(obj);
    if ((mode & 4U) != 0 || _Var11) {
      if ((mode & 4U) == 0) {
        pcVar40 = obj->kind->text;
        if (pcVar40 != (char *)0x0) {
          textblock_append(tb,"%s",pcVar40);
        }
        if ((obj->known->ego != (ego_item *)0x0) &&
           (pcVar34 = obj->ego->text, pcVar34 != (char *)0x0)) {
          if (pcVar40 != (char *)0x0) {
            textblock_append(tb,"  ");
            pcVar34 = obj->ego->text;
          }
          goto LAB_00198dbe;
        }
        if (pcVar40 != (char *)0x0) {
          textblock_append(tb,"\n\n");
        }
      }
      else {
        pcVar34 = obj->ego->text;
        if (pcVar34 != (char *)0x0) {
LAB_00198dbe:
          textblock_append(tb,"%s\n\n",pcVar34);
        }
      }
    }
  }
  _Var11 = object_fully_known(obj);
  if (((_Var11) || ((obj->known->notice & 2) == 0)) || (_Var11 = tval_is_useable(obj), _Var11)) {
    bVar48 = false;
  }
  else {
    textblock_append(tb,"You do not know the full extent of this item\'s powers.\n");
    bVar48 = true;
  }
  _Var11 = object_is_known_artifact(obj);
  if ((_Var11) && (paVar18 = get_artifact_set(obj->artifact), paVar18 != (artifact_set *)0x0)) {
    psVar19 = (set_item *)&paVar18->set_item;
    do {
      psVar19 = psVar19->next;
      if (psVar19 == (set_item *)0x0) goto LAB_00198e60;
    } while (psVar19->aidx != obj->artifact->aidx);
    textblock_append(tb,"\n");
    textblock_append_c(tb,'\x06',"%s.\n",paVar18->text);
    bVar48 = true;
  }
LAB_00198e60:
  poVar25 = obj->known;
  pcVar6 = poVar25->curses;
  if ((pcVar6 != (curse_data *)0x0) && (bVar48 = true, 1 < z_info->curse_max)) {
    uVar31 = 1;
    lVar26 = 0xd;
    paVar21 = z_info;
    do {
      if (pcVar6[uVar31].power != L'\0') {
        textblock_append(tb,"It ");
        textblock_append_c(tb,'\f',"%s",*(undefined8 *)(curses->conflict_flags + lVar26 * 8 + -0x28)
                          );
        if (pcVar6[uVar31].power == L'd') {
          textblock_append(tb,"; this curse cannot be removed");
        }
        else {
          textblock_append(tb," (power %d)");
        }
        textblock_append(tb,".\n");
        paVar21 = z_info;
      }
      uVar31 = uVar31 + 1;
      lVar26 = lVar26 + 7;
    } while (uVar31 < paVar21->curse_max);
    poVar25 = obj->known;
    bVar48 = true;
  }
  peVar7 = poVar25->ego;
  bVar46 = peVar7 != (ego_item *)0x0;
  _Var11 = tval_can_have_flavor_k(obj->kind);
  if (_Var11) {
    _Var11 = object_flavor_is_aware(obj);
    bVar46 = _Var11 || peVar7 != (ego_item *)0x0;
  }
  poVar25 = obj->known;
  lVar35 = 0x29;
  lVar26 = 0;
  bVar36 = 0;
  do {
    bVar47 = *(short *)(poVar25->flags + lVar35 * 2 + -0x4c) != 0;
    bVar36 = bVar36 | bVar47;
    lVar26 = lVar26 + (ulong)bVar47;
    lVar35 = lVar35 + 1;
  } while (lVar35 != 0x3a);
  if (lVar26 != 0) {
    lVar26 = 0;
    do {
      poVar20 = lookup_obj_property(L'\x02',(wchar_t)lVar26);
      sVar3 = obj->known->modifiers[lVar26];
      if (sVar3 != 0) {
        if ((bool)((mode & 0xcU) == 0U & bVar36)) {
          textblock_append_c(tb,(0 < sVar3) * '\t' + '\x04',"%+i %s.\n");
        }
        else if (bVar46) {
          textblock_append(tb,"Affects your %s\n",poVar20->name);
        }
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != 0x11);
    poVar25 = obj->known;
    bVar48 = true;
  }
  p_Var8 = poVar25->slays;
  if (p_Var8 != (_Bool *)0x0) {
    _Var11 = tval_is_weapon(obj);
    if (_Var11) {
      pcVar34 = "Slays ";
    }
    else {
      _Var11 = tval_is_fuel(obj);
      pcVar34 = "It causes your melee attacks to slay ";
      if (_Var11) {
        pcVar34 = "Slays ";
      }
    }
    iVar29 = 0;
    textblock_append(tb,pcVar34);
    if ((ulong)z_info->slay_max < 2) {
LAB_0019aa98:
      __assert_fail("count >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-info.c"
                    ,0x194,"_Bool describe_slays(textblock *, const struct object *)");
    }
    uVar31 = 1;
    do {
      iVar29 = iVar29 + (uint)p_Var8[uVar31];
      uVar31 = uVar31 + 1;
    } while (z_info->slay_max != uVar31);
    if (iVar29 == 0) goto LAB_0019aa98;
    uVar31 = 1;
    lVar26 = 0;
    paVar21 = z_info;
    do {
      if (p_Var8[uVar31] == true) {
        textblock_append(tb,"%s",*(undefined8 *)((long)&slays[1].name + lVar26));
        if (0x14 < *(int *)((long)&slays[1].multiplier + lVar26)) {
          textblock_append(tb," (powerfully)");
        }
        pcVar34 = ".\n";
        if (1 < iVar29) {
          pcVar34 = ", ";
        }
        textblock_append(tb,pcVar34);
        iVar29 = iVar29 + -1;
        paVar21 = z_info;
      }
      uVar31 = uVar31 + 1;
      lVar26 = lVar26 + 0x38;
    } while (uVar31 < paVar21->slay_max);
    poVar25 = obj->known;
    bVar48 = true;
  }
  p_Var8 = poVar25->brands;
  if (p_Var8 != (_Bool *)0x0) {
    _Var11 = tval_is_weapon(obj);
    if (_Var11) {
      pcVar34 = "Branded with ";
    }
    else {
      _Var11 = tval_is_fuel(obj);
      pcVar34 = "It brands your melee attacks with ";
      if (_Var11) {
        pcVar34 = "Branded with ";
      }
    }
    iVar29 = 0;
    textblock_append(tb,pcVar34);
    if ((ulong)z_info->brand_max < 2) {
LAB_0019aab7:
      __assert_fail("count >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-info.c"
                    ,0x1ba,"_Bool describe_brands(textblock *, const struct object *)");
    }
    uVar31 = 1;
    do {
      iVar29 = iVar29 + (uint)p_Var8[uVar31];
      uVar31 = uVar31 + 1;
    } while (z_info->brand_max != uVar31);
    if (iVar29 == 0) goto LAB_0019aab7;
    uVar31 = 1;
    lVar26 = 0;
    paVar21 = z_info;
    do {
      if (p_Var8[uVar31] == true) {
        if (*(int *)((long)&brands[1].multiplier + lVar26) < 0xf) {
          textblock_append(tb,"weak ");
        }
        textblock_append(tb,"%s",*(undefined8 *)((long)&brands[1].name + lVar26));
        pcVar34 = ".\n";
        if (1 < iVar29) {
          pcVar34 = ", ";
        }
        textblock_append(tb,pcVar34);
        iVar29 = iVar29 + -1;
        paVar21 = z_info;
      }
      uVar31 = uVar31 + 1;
      lVar26 = lVar26 + 0x30;
    } while (uVar31 < paVar21->brand_max);
    bVar48 = true;
  }
  bVar46 = false;
  uVar42 = 0;
  uVar31 = 0;
  uVar41 = 0;
  lVar26 = 0;
  do {
    sVar3 = (short)local_508.stat_add[lVar26 + -0x1c];
    local_3c8[0].stat_add[lVar26] = (int)sVar3;
    if (sVar3 == 0) {
      uVar31 = uVar31 + 1;
LAB_00199292:
      bVar46 = true;
    }
    else {
      if (sVar3 < 100) {
        uVar41 = uVar41 + 1;
        goto LAB_00199292;
      }
      uVar42 = uVar42 + (sVar3 != 100);
      bVar46 = (bool)(sVar3 != 100 | bVar46);
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x1c);
  if (uVar31 != 0) {
    textblock_append(tb,"Provides immunity to ");
    lVar26 = 2;
    uVar45 = 0;
    do {
      if (local_3c8[0].stat_add[uVar45] == 0) {
        textblock_append(tb,"%s",*(undefined8 *)(&projections->index + lVar26));
        if (1 < uVar31) {
          textblock_append(tb,", ");
        }
        uVar31 = uVar31 - 1;
      }
      if (0x1a < uVar45) break;
      uVar45 = uVar45 + 1;
      lVar26 = lVar26 + 0x1c;
    } while (uVar31 != 0);
    textblock_append(tb,".\n");
  }
  if (uVar41 != 0) {
    textblock_append(tb,"Provides resistance to ");
    lVar26 = 2;
    uVar31 = 0;
    do {
      iVar29 = local_3c8[0].stat_add[uVar31];
      if (iVar29 != 0 && iVar29 < 100) {
        textblock_append(tb,"%s (%d%%)",*(undefined8 *)(&projections->index + lVar26),
                         (ulong)(100 - iVar29));
        if (1 < uVar41) {
          textblock_append(tb,", ");
        }
        uVar41 = uVar41 - 1;
      }
      if (0x1a < uVar31) break;
      uVar31 = uVar31 + 1;
      lVar26 = lVar26 + 0x1c;
    } while (uVar41 != 0);
    textblock_append(tb,".\n");
  }
  if (uVar42 != 0) {
    textblock_append(tb,"Makes you vulnerable to ");
    lVar26 = 2;
    uVar31 = 0;
    do {
      if (100 < local_3c8[0].stat_add[uVar31]) {
        textblock_append(tb,"%s (%d%%)",*(undefined8 *)(&projections->index + lVar26),
                         (ulong)(local_3c8[0].stat_add[uVar31] - 100));
        if (1 < uVar42) {
          textblock_append(tb,", ");
        }
        uVar42 = uVar42 - 1;
      }
      if (0x1a < uVar31) break;
      uVar31 = uVar31 + 1;
      lVar26 = lVar26 + 0x1c;
    } while (uVar42 != 0);
    textblock_append(tb,".\n");
  }
  wVar30 = L'\x01';
  iVar29 = 0;
  do {
    poVar20 = lookup_obj_property(L'\x03',wVar30);
    if ((poVar20->subtype == L'\x02') &&
       (_Var11 = flag_has_dbg(local_5be,6,poVar20->index,"flags","prop->index"), _Var11)) {
      lVar26 = (long)iVar29;
      iVar29 = iVar29 + 1;
      *(char **)(local_3c8[0].stat_add + lVar26 * 2) = poVar20->desc;
    }
    wVar30 = wVar30 + L'\x01';
  } while (wVar30 != L'-');
  bVar47 = true;
  if (!bVar46) {
    bVar47 = bVar48;
  }
  if (iVar29 != 0) {
    textblock_append(tb,"Provides protection from ");
    info_out_list(tb,(char **)local_3c8,(long)iVar29);
    bVar47 = true;
  }
  lVar26 = 0;
  do {
    *(byte *)((long)local_508.stat_add + lVar26) =
         *(byte *)((long)local_508.stat_add + lVar26 * 4 + -0x6e) >> 1 & 1;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x1c);
  ppcVar22 = &projections->name;
  lVar26 = 0;
  iVar29 = 0;
  do {
    if (*(char *)((long)local_508.stat_add + lVar26) == '\x01') {
      lVar35 = (long)iVar29;
      iVar29 = iVar29 + 1;
      *(char **)(local_3c8[0].stat_add + lVar35 * 2) = *ppcVar22;
    }
    lVar26 = lVar26 + 1;
    ppcVar22 = ppcVar22 + 0xe;
  } while (lVar26 != 0x1c);
  if (iVar29 != 0) {
    textblock_append(tb,"Cannot be harmed by ");
    info_out_list(tb,(char **)local_3c8,(long)iVar29);
    bVar47 = true;
  }
  lVar26 = 0;
  do {
    *(byte *)((long)local_508.stat_add + lVar26) =
         *(byte *)((long)local_508.stat_add + lVar26 * 4 + -0x6e) & 1;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x1c);
  ppcVar22 = &projections->name;
  lVar26 = 0;
  iVar29 = 0;
  do {
    if (*(char *)((long)local_508.stat_add + lVar26) == '\x01') {
      lVar35 = (long)iVar29;
      iVar29 = iVar29 + 1;
      *(char **)(local_3c8[0].stat_add + lVar35 * 2) = *ppcVar22;
    }
    lVar26 = lVar26 + 1;
    ppcVar22 = ppcVar22 + 0xe;
  } while (lVar26 != 0x1c);
  if (iVar29 != 0) {
    textblock_append(tb,"Can be destroyed by ");
    info_out_list(tb,(char **)local_3c8,(long)iVar29);
    bVar47 = true;
  }
  iVar29 = 0;
  wVar30 = L'\0';
  do {
    poVar20 = lookup_obj_property(L'\x01',wVar30);
    wVar15 = sustain_flag(poVar20->index);
    _Var11 = flag_has_dbg(local_5be,6,wVar15,"flags","sustain_flag(prop->index)");
    if (_Var11) {
      lVar26 = (long)iVar29;
      iVar29 = iVar29 + 1;
      *(char **)(local_3c8[0].stat_add + lVar26 * 2) = poVar20->name;
    }
    wVar30 = wVar30 + L'\x01';
  } while (wVar30 != L'\x05');
  if (iVar29 != 0) {
    textblock_append(tb,"Sustains ");
    info_out_list(tb,(char **)local_3c8,(long)iVar29);
    bVar47 = true;
  }
  bVar48 = false;
  wVar30 = L'\x01';
  do {
    while( true ) {
      poVar20 = lookup_obj_property(L'\x03',wVar30);
      if ((((uint)poVar20->subtype < 7) && ((0x68U >> (poVar20->subtype & 0x1fU) & 1) != 0)) &&
         (_Var11 = flag_has_dbg(local_5be,6,poVar20->index,"flags","prop->index"), _Var11)) break;
      wVar30 = wVar30 + L'\x01';
      if (wVar30 == L'-') {
        if (!bVar48) goto LAB_00199786;
        goto LAB_0019976f;
      }
    }
    textblock_append(tb,"%s.  ",poVar20->desc);
    bVar48 = true;
    bVar46 = wVar30 != L',';
    wVar30 = wVar30 + L'\x01';
  } while (bVar46);
LAB_0019976f:
  textblock_append(tb,"\n");
  bVar47 = true;
LAB_00199786:
  _Var11 = tval_is_light(obj);
  if ((_Var11) || (0 < obj->modifiers[0xd])) {
    _Var12 = flag_has_dbg(obj->flags,6,0x22,"obj->flags","OF_LIGHT_2");
    iVar29 = 2;
    if (!_Var12) {
      _Var12 = flag_has_dbg(obj->flags,6,0x23,"obj->flags","OF_LIGHT_3");
      iVar29 = (uint)_Var12 + (uint)_Var12 * 2;
    }
    uVar38 = obj->known->modifiers[0xd] + iVar29;
    if (uVar38 != 0) {
      _Var12 = flag_has_dbg(obj->known->flags,6,0x19,"obj->known->flags","OF_NO_FUEL");
      uVar43 = 0;
      bVar48 = false;
      if (!_Var12) {
        bVar48 = obj->known->artifact == (artifact *)0x0;
      }
      if ((_Var11) &&
         (_Var11 = flag_has_dbg(obj->known->flags,6,0x18,"obj->known->flags","OF_TAKES_FUEL"),
         _Var11)) {
        uVar43 = (uint)z_info->fuel_lamp;
      }
      _Var11 = tval_is_light(obj);
      if (_Var11) {
        textblock_append(tb,"Intensity ");
        textblock_append_c(tb,'\r',"%d",(ulong)uVar38);
        textblock_append(tb," light.");
        if (!(bool)(obj->artifact != (artifact *)0x0 | bVar48)) {
          textblock_append(tb,"  No fuel required.");
        }
        bVar47 = true;
        if ((mode & 1U) == 0) {
          if (uVar43 == 0) {
            textblock_append(tb,"  Cannot be refueled.");
          }
          else {
            textblock_append(tb,"  Refills other lanterns up to %d turns of fuel.",(ulong)uVar43);
          }
        }
        textblock_append(tb,"\n");
      }
      else {
        bVar47 = true;
      }
    }
  }
  _Var11 = obj_can_browse(obj);
  if (_Var11) {
    textblock_append(tb,"\nYou can read this book.\n");
    bVar47 = true;
  }
  if ((mode & 4U) == 0) {
LAB_00199af8:
    bVar46 = bVar47;
    if (bVar47) goto LAB_00199b00;
  }
  else {
    peVar7 = obj->ego;
    flags_00 = peVar7->kind_flags;
    _Var11 = flag_has_dbg(flags_00,4,5,"ego->kind_flags","KF_RAND_HI_RES");
    if (_Var11) {
      pcVar34 = "It provides one random higher resistance.  ";
LAB_00199a7a:
      textblock_append(tb,pcVar34);
      bVar48 = true;
    }
    else {
      _Var11 = flag_has_dbg(flags_00,4,6,"ego->kind_flags","KF_RAND_SUSTAIN");
      if (_Var11) {
        pcVar34 = "It provides one random sustain.  ";
        goto LAB_00199a7a;
      }
      _Var11 = flag_has_dbg(flags_00,4,7,"ego->kind_flags","KF_RAND_POWER");
      if (_Var11) {
        pcVar34 = "It provides one random ability.  ";
        goto LAB_00199a7a;
      }
      _Var11 = flag_has_dbg(flags_00,4,3,"ego->kind_flags","KF_RAND_RES");
      if (_Var11) {
        pcVar34 = "It provides one random resistance.  ";
        goto LAB_00199a7a;
      }
      bVar48 = false;
    }
    _Var11 = flag_has_dbg(peVar7->flags,6,0x19,"ego->flags","OF_NO_FUEL");
    if ((_Var11) &&
       (_Var11 = flag_has_dbg(peVar7->flags_off,6,0x18,"ego->flags_off","OF_TAKES_FUEL"), _Var11)) {
      textblock_append(tb,"It burns forever without fuel.  ");
      bVar46 = true;
    }
    else {
      bVar46 = true;
      if (!bVar48) goto LAB_00199af8;
    }
LAB_00199b00:
    bVar47 = bVar46;
    textblock_append(tb,"\n");
  }
  if ((mode & 4U) == 0) {
    if (((mode & 1U) == 0) || (obj->artifact != (artifact *)0x0)) {
      _Var11 = object_is_in_store(obj);
      if (_Var11) {
        _Var11 = tval_is_useable(obj);
      }
      else {
        _Var11 = false;
      }
      _Var12 = object_effect_is_known(obj);
      peVar23 = object_effect(obj);
      if (_Var12 || _Var11 != false) {
        prVar1 = &obj->time;
        v_01 = *prVar1;
        v_00 = *prVar1;
        v = *prVar1;
        _Var11 = effect_aim(peVar23);
        iVar16 = randcalc(v,0,MAXIMISE);
        iVar29 = 0;
        local_5d4 = 0;
        if (0 < iVar16) {
          iVar29 = randcalc(v_00,0,MINIMISE);
          local_5d4 = randcalc(v_01,0,MAXIMISE);
        }
        _Var12 = tval_is_edible(obj);
        if (_Var12) {
          wVar30 = L'\0';
        }
        else {
          _Var12 = tval_is_potion(obj);
          wVar30 = L'\0';
          if ((!_Var12) && (_Var12 = tval_is_scroll(obj), !_Var12)) {
            wVar30 = get_use_device_chance(obj);
          }
        }
        if (peVar23 == (effect *)0x0) {
LAB_00199c95:
          peVar23 = object_effect(obj);
          if (peVar23 == (effect *)0x0) {
            peVar23 = (effect *)0x0;
            goto LAB_00199cbd;
          }
          _Var12 = tval_is_edible(obj);
          if (_Var12) {
            pcVar34 = "It can be eaten.\n";
          }
          else {
            _Var12 = tval_is_potion(obj);
            if (_Var12) {
              pcVar34 = "It can be drunk.\n";
            }
            else {
              _Var12 = tval_is_scroll(obj);
              if (_Var12) {
                pcVar34 = "It can be read.\n";
              }
              else if (_Var11 == false) {
                pcVar34 = "It can be activated.\n";
              }
              else {
                pcVar34 = "It can be aimed.\n";
              }
            }
          }
          textblock_append(tb,pcVar34);
        }
        else {
LAB_00199cbd:
          if ((obj->activation == (activation *)0x0) || (obj->activation->desc == (char *)0x0)) {
            if (obj->artifact == (artifact *)0x0) {
              pwVar24 = &obj->kind->level;
            }
            else {
              pwVar24 = &obj->artifact->level;
            }
            iVar37 = (player->state).skills[2] - *pwVar24;
            iVar16 = 0;
            if (-2 < iVar37) {
              iVar16 = iVar37 / 2;
            }
            if (_Var11 == false) {
              _Var11 = tval_is_edible(obj);
              if (_Var11) {
                pcVar34 = "When eaten, it ";
              }
              else {
                _Var11 = tval_is_potion(obj);
                if (_Var11) {
                  pcVar34 = "When quaffed, it ";
                }
                else {
                  _Var11 = tval_is_scroll(obj);
                  pcVar34 = "When activated, it ";
                  if (_Var11) {
                    pcVar34 = "When read, it ";
                  }
                }
              }
            }
            else {
              pcVar34 = "When aimed, it ";
            }
            tba = effect_describe(peVar23,pcVar34,iVar16,false);
            if (tba == (textblock *)0x0) goto LAB_00199fbc;
            textblock_append_textblock(tb,tba);
            textblock_free(tba);
          }
          else {
            textblock_append(tb,"When activated, it ");
            textblock_append(tb,"%s",obj->activation->desc);
          }
          textblock_append(tb,".\n");
          if (iVar29 != 0 || local_5d4 != 0) {
            wVar17 = turn_energy((player->state).speed);
            wVar15 = L'\n';
            if ((mode & 2U) != 0) {
              wVar15 = wVar17;
            }
            textblock_append(tb,"Takes ");
            uVar38 = (iVar29 * wVar15) / 10;
            uVar43 = (wVar15 * local_5d4) / 10;
            textblock_append_c(tb,'\r',"%d",(ulong)uVar38);
            if (uVar38 != uVar43) {
              textblock_append(tb," to ");
              textblock_append_c(tb,'\r',"%d",(ulong)uVar43);
            }
            textblock_append(tb," turns to recharge");
            if (((mode & 2U) != 0) && ((player->state).speed != L'n')) {
              textblock_append(tb," at your current speed");
            }
            textblock_append(tb,".\n");
          }
          if (L'\0' < wVar30) {
            textblock_append(tb,"Your chance of success is %d.%d%%\n",
                             (ulong)(uint)((1000 - wVar30) / 10),(ulong)(uint)((1000 - wVar30) % 10)
                            );
          }
        }
        textblock_append(tb,"\n");
        bVar47 = true;
      }
      else if (peVar23 != (effect *)0x0) {
        _Var11 = tval_is_wand(obj);
        if (!_Var11) {
          _Var12 = tval_is_rod(obj);
          wVar30 = L'\0';
          local_5d4 = 0;
          iVar29 = 0;
          _Var11 = false;
          if (!_Var12) goto LAB_00199c95;
        }
        _Var11 = true;
        wVar30 = L'\0';
        local_5d4 = 0;
        iVar29 = 0;
        goto LAB_00199c95;
      }
    }
LAB_00199fbc:
    if ((mode & 2U) == 0) goto LAB_0019aa2f;
    poVar25 = equipped_item_by_slot_name(player,"shooting");
    _Var11 = tval_is_melee_weapon(obj);
    bVar48 = (player->state).ammo_tval == (uint)obj->tval;
    bVar46 = poVar25 != (object *)0x0;
    if (_Var11) {
      _Var12 = flag_has_dbg(obj->flags,6,0x29,"obj->flags","OF_THROWING");
      local_5b8 = (uint)CONCAT71(extraout_var,_Var12);
    }
    else {
      local_5b8 = 0;
    }
    _Var12 = tval_is_ammo(obj);
    if (_Var12) {
      _Var12 = flag_has_dbg(obj->flags,6,0x29,"obj->flags","OF_THROWING");
    }
    else {
      _Var12 = false;
    }
    poVar25 = equipped_item_by_slot_name(player,"shooting");
    _Var13 = tval_is_melee_weapon(obj);
    bVar49 = (player->state).ammo_tval != (uint)obj->tval;
    local_5b4 = 0;
    if (_Var13) {
LAB_0019a0fd:
      _Var14 = false;
    }
    else {
      _Var14 = false;
      if (poVar25 == (object *)0x0 || bVar49) {
        _Var14 = tval_is_potion(obj);
        if (((!_Var14) || (obj->dd == '\0')) || (obj->ds == '\0')) goto LAB_0019a0fd;
        _Var14 = object_flavor_is_aware(obj);
      }
    }
    if (poVar25 != (object *)0x0 && !bVar49) {
      uVar38 = (player->state).ammo_mult * 2 + 0xc;
      uVar43 = (uint)z_info->max_range;
      if ((int)uVar38 < (int)(uint)z_info->max_range) {
        uVar43 = uVar38;
      }
      local_5b4 = uVar43 * 5;
    }
    bVar49 = bVar48 && bVar46;
    local_5a4 = breakage_chance(obj,true);
    if (_Var13) {
      wVar30 = slot_by_name(player,"weapon");
      poVar25 = equipped_item_by_slot_name(player,"weapon");
      (player->body).slots[wVar30].obj = obj;
      ppVar10 = player;
      memcpy(local_3c8,&player->state,0x13c);
      local_3c8[0].stat_ind[0] = 0;
      local_3c8[0].stat_ind[3] = 0;
      calc_bonuses(ppVar10,local_3c8,true,false);
      (player->body).slots[wVar30].obj = poVar25;
      if ((_Var11 || bVar48 && bVar46) || _Var12 != false) {
        textblock_append_c(tb,'\t',"Combat info:\n");
        if (local_3c8[0].heavy_wield != false) {
          pcVar34 = "You are too weak to use this weapon.\n";
          uVar32 = '\f';
          goto LAB_0019a272;
        }
        goto LAB_0019a279;
      }
LAB_0019a4d3:
      if (_Var14 != false) {
        pcVar34 = "It can be thrown at creatures with damaging effect.\n";
        goto LAB_0019a726;
      }
    }
    else {
      if ((!_Var11 && (!bVar48 || !bVar46)) && _Var12 == false) goto LAB_0019a4d3;
      pcVar34 = "Combat info:\n";
      uVar32 = '\t';
LAB_0019a272:
      textblock_append_c(tb,uVar32,pcVar34);
LAB_0019a279:
      local_5f1 = _Var11 || bVar49;
      wVar30 = slot_by_name(player,"weapon");
      poVar25 = slot_object(player,wVar30);
      _Var11 = tval_is_melee_weapon(obj);
      if (_Var11) {
        (player->body).slots[wVar30].obj = obj;
        ppVar10 = player;
        local_5a0 = poVar25;
        memcpy(&local_508,&player->state,0x13c);
        iVar29 = 0;
        local_508.stat_ind[0] = 0;
        local_508.stat_ind[3] = 0;
        uVar38 = 1;
        calc_bonuses(ppVar10,&local_508,true,false);
        wVar15 = local_508.num_blows;
        local_3c8[0].stat_add[2] = local_508.num_blows;
        if (local_508.stat_ind[3] < 0x26) {
          local_5a8 = local_508.stat_ind[0];
          iVar37 = 0x26 - local_508.stat_ind[0];
          local_5ac = 0x26 - local_508.stat_ind[3];
          iVar16 = local_508.num_blows / 10;
          uVar38 = 1;
          if (iVar37 < 2) {
            iVar37 = 1;
          }
          if (local_5ac < 2) {
            local_5ac = 1;
          }
          iVar44 = -1;
          local_5b0 = -1;
          do {
            if (local_5a8 < 0x26) {
              iVar39 = 0;
              do {
                if (uVar38 == 0x4c) {
                  uVar38 = 0x4c;
                  goto LAB_0019a507;
                }
                local_508.stat_ind[0] = iVar39;
                local_508.stat_ind[3] = iVar29;
                calc_bonuses(player,&local_508,true,false);
                iVar9 = (local_508.num_blows / 10) * 10;
                if ((iVar16 * 10 < iVar9) && (iVar39 < iVar44 || iVar44 == -1)) {
                  lVar26 = (long)(int)uVar38;
                  local_3c8[0].stat_add[lVar26 * 3] = iVar39;
                  local_3c8[0].stat_add[lVar26 * 3 + 1] = iVar29;
                  local_3c8[0].stat_add[lVar26 * 3 + 2] = iVar9;
                  uVar38 = uVar38 + 1;
                  iVar44 = iVar39;
                  break;
                }
                if ((wVar15 < local_508.num_blows) &&
                   ((local_5b0 == -1 || iVar39 < local_5b0) && (iVar39 < iVar44 || iVar44 == -1))) {
                  lVar26 = (long)(int)uVar38;
                  local_3c8[0].stat_add[lVar26 * 3] = iVar39;
                  local_3c8[0].stat_add[lVar26 * 3 + 1] = iVar29;
                  local_3c8[0].stat_add[lVar26 * 3 + 2] = local_508.num_blows;
                  uVar38 = uVar38 + 1;
                  local_5b0 = iVar39;
                }
                iVar39 = iVar39 + 1;
              } while (iVar37 != iVar39);
            }
            iVar29 = iVar29 + 1;
          } while (iVar29 != local_5ac);
          (player->body).slots[wVar30].obj = local_5a0;
          if (uVar38 == 0) goto LAB_0019a681;
        }
        else {
LAB_0019a507:
          (player->body).slots[wVar30].obj = local_5a0;
        }
        iVar29 = local_3c8[0].stat_add[2];
        textblock_append_c(tb,'\r',"%d.%d ",(ulong)(uint)(local_3c8[0].stat_add[2] / 100),
                           (ulong)(uint)((local_3c8[0].stat_add[2] / 10) % 10));
        pcVar34 = "";
        if (L'd' < iVar29) {
          pcVar34 = "s";
        }
        textblock_append(tb,"blow%s/round.\n",pcVar34);
        if (1 < (int)uVar38) {
          lVar26 = 0;
          do {
            uVar31 = (ulong)*(uint *)((long)local_3c8[0].stat_add + lVar26 + 0xc);
            iVar29 = *(int *)((long)local_3c8[0].stat_ind + lVar26);
            uVar43 = iVar29 * -0x33333333 + 0x19999998;
            if ((uVar43 >> 1 | (uint)((uVar43 & 1) != 0) << 0x1f) < 0x19999999) {
              textblock_append(tb,"With +%d STR and +%d DEX you would get %d.%d blows\n",uVar31,
                               (ulong)*(uint *)((long)local_3c8[0].stat_add + lVar26 + 0x10),
                               (ulong)(uint)(iVar29 / 100),(ulong)(uint)((iVar29 / 10) % 10));
            }
            else {
              textblock_append(tb,"With +%d STR and +%d DEX you would attack a bit faster\n",uVar31)
              ;
            }
            lVar26 = lVar26 + 0xc;
          } while ((ulong)uVar38 * 0xc + -0xc != lVar26);
        }
      }
LAB_0019a681:
      if (bVar49) {
        textblock_append(tb,"When fired, hits targets up to ");
        textblock_append_c(tb,'\r',"%d");
        textblock_append(tb," feet away.\n");
      }
      if (local_5f1) {
        describe_damage(tb,obj,false);
      }
      if ((local_5b8 & 1) != 0 || _Var12 != false) {
        describe_damage(tb,obj,true);
      }
      if (bVar49) {
        textblock_append_c(tb,'\r',"%d%%");
        pcVar34 = " chance of breaking upon contact.\n";
LAB_0019a726:
        textblock_append(tb,pcVar34);
      }
      textblock_append(tb,"\n");
      bVar47 = true;
    }
    if ((mode & 3U) != 2) goto LAB_0019aa2f;
    _Var11 = tval_is_wearable(obj);
    if (((_Var11) && ((_Var11 = tval_is_melee_weapon(obj), _Var11 || (0 < obj->modifiers[8])))) &&
       ((_Var11 = tval_is_melee_weapon(obj), _Var11 || (obj->known->modifiers[8] != 0)))) {
      wVar30 = wield_slot(obj);
      poVar25 = slot_object(player,wVar30);
      (player->body).slots[wVar30].obj = obj;
      ppVar10 = player;
      memcpy(local_3c8,&player->state,0x13c);
      lVar26 = 0;
      local_3c8[0].stat_ind[0] = 0;
      local_3c8[0].stat_ind[3] = 0;
      calc_bonuses(ppVar10,local_3c8,true,false);
      (player->body).slots[wVar30].obj = poVar25;
      calc_digging_chances(local_3c8,local_508.stat_add);
      do {
        iVar29 = local_508.stat_add[lVar26];
        uVar38 = 0;
        if (iVar29 != 0) {
          if (0x63f < iVar29) {
            iVar29 = 0x640;
          }
          uVar38 = (uint)(16000 / (long)iVar29);
        }
        local_598[lVar26] = uVar38;
        lVar26 = lVar26 + 1;
      } while (lVar26 != 5);
      puVar28 = &describe_digger_names;
      lVar26 = 0;
      do {
        if ((lVar26 == 0) && (0 < (int)local_598[0])) {
          _Var11 = tval_is_melee_weapon(obj);
          pcVar34 = "With this item, your current weapon clears ";
          if (_Var11) {
            pcVar34 = "Clears ";
          }
          pcVar40 = ", ";
LAB_0019a8ba:
          textblock_append(tb,pcVar34);
        }
        else {
          pcVar34 = "and ";
          pcVar40 = ".\n";
          if (lVar26 == 0xc) goto LAB_0019a8ba;
          pcVar40 = ", ";
          if (lVar26 != 0) {
            pcVar34 = "and ";
            pcVar40 = ", ";
            if (*(int *)((long)local_598 + lVar26) == 0) goto LAB_0019a8ba;
          }
        }
        uVar38 = *(uint *)((long)local_598 + lVar26);
        if (uVar38 == 0) {
          textblock_append_c(tb,'\f',"doesn\'t affect ");
          textblock_append(tb,"%s.\n",*puVar28);
          break;
        }
        textblock_append(tb,"%s in ",*puVar28);
        if (uVar38 == 10) {
          textblock_append_c(tb,'\r',"1 ");
          pcVar34 = "";
        }
        else {
          if ((int)uVar38 < 100) {
            textblock_append_c(tb,'\x05',"%d.%d ",(ulong)(uint)((int)uVar38 / 10),
                               (ulong)(uint)((int)uVar38 % 10));
          }
          else {
            uVar32 = '\x04';
            if (uVar38 < 1000) {
              uVar32 = '\v';
            }
            textblock_append_c(tb,uVar32,"%d ",(ulong)(uVar38 + 5) / 10);
          }
          pcVar34 = "s";
        }
        textblock_append(tb,"turn%s%s",pcVar34,pcVar40);
        puVar28 = puVar28 + 1;
        lVar26 = lVar26 + 4;
      } while (lVar26 != 0x10);
      bVar47 = true;
      goto LAB_0019aa2f;
    }
  }
  else {
LAB_0019aa2f:
    if ((mode & 1U) != 0) {
      return tb;
    }
  }
  if (bVar47) {
    textblock_append(tb,"\n%s\n",kb_info[obj->tval].text);
  }
  else {
    pcVar34 = "\n\nThis item does not seem to possess any special abilities.";
LAB_001989c2:
    textblock_append(tb,pcVar34);
  }
  return tb;
}

Assistant:

static textblock *object_info_out(const struct object *obj, int mode)
{
	bitflag flags[OF_SIZE];
	struct element_info el_info[ELEM_MAX];
	bool something = false;

	bool terse = mode & OINFO_TERSE ? true : false;
	bool subjective = mode & OINFO_SUBJ ? true : false;
	bool ego = mode & OINFO_EGO ? true : false;
	textblock *tb = textblock_new();

	assert(obj->known);

	/* Unaware objects get simple descriptions */
	if (obj->kind != obj->known->kind) {
		textblock_append(tb, "\n\nYou do not know what this is.\n");
		return tb;
	}

	/* Grab the object flags */
	get_known_flags(obj, mode, flags);

	/* Grab the element info */
	get_known_elements(obj, mode, el_info);

	if (subjective) describe_origin(tb, obj, terse);
	if (!terse) describe_flavor_text(tb, obj, ego);

	if (!object_fully_known(obj) &&	(obj->known->notice & OBJ_NOTICE_ASSESSED) && !tval_is_useable(obj)) {
		textblock_append(tb, "You do not know the full extent of this item's powers.\n");
		something = true;
	}

	if (describe_set(tb, obj)) something = true;
	if (describe_curses(tb, obj, flags)) something = true;
	if (describe_stats(tb, obj, mode)) something = true;
	if (describe_slays(tb, obj)) something = true;
	if (describe_brands(tb, obj)) something = true;
	if (describe_elements(tb, el_info)) something = true;
	if (describe_protects(tb, flags)) something = true;
	if (describe_ignores(tb, el_info)) something = true;
	if (describe_hates(tb, el_info)) something = true;
	if (describe_sustains(tb, flags)) something = true;
	if (describe_misc_magic(tb, flags)) something = true;
	if (describe_light(tb, obj, mode)) something = true;
	if (describe_book(tb, obj, mode)) something = true;
	if (ego && describe_ego(tb, obj->ego)) something = true;
	if (something) textblock_append(tb, "\n");

	/* Skip all the very specific information where we are giving general
	   ego knowledge rather than for a single item - abilities can vary */
	if (!ego) {
		if (describe_effect(tb, obj, terse, subjective)) {
			something = true;
			textblock_append(tb, "\n");
		}

		if (subjective && describe_combat(tb, obj)) {
			something = true;
			textblock_append(tb, "\n");
		}

		if (!terse && subjective && describe_digger(tb, obj)) something = true;
	}

	/* Don't append anything in terse (for chararacter dump) */
	if (!terse) {
		if (!something) {
			textblock_append(tb, "\n\nThis item does not seem to possess any special abilities.");
		} else {
			textblock_append(tb, "\n%s\n", kb_info[obj->tval].text);
		}
	}

	return tb;
}